

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json_visitor<wchar_t>::visit_typed_array
          (basic_json_visitor<wchar_t> *this,span<const_unsigned_long,_18446744073709551615UL> *s,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  basic_json_visitor<wchar_t> *this_00;
  basic_json_visitor<wchar_t> *pbVar1;
  span<const_unsigned_long,_18446744073709551615UL> *in_RSI;
  size_t in_RDI;
  const_iterator p;
  ser_context *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  semantic_tag tag_00;
  basic_json_visitor<wchar_t> *in_stack_ffffffffffffffd0;
  basic_json_visitor<wchar_t> *this_01;
  
  tag_00 = (semantic_tag)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  detail::span<const_unsigned_long,_18446744073709551615UL>::size(in_RSI);
  begin_array(in_stack_ffffffffffffffd0,in_RDI,tag_00,in_stack_ffffffffffffffb8,
              (error_code *)0x372870);
  this_00 = (basic_json_visitor<wchar_t> *)
            detail::span<const_unsigned_long,_18446744073709551615UL>::begin(in_RSI);
  while( true ) {
    this_01 = this_00;
    pbVar1 = (basic_json_visitor<wchar_t> *)
             detail::span<const_unsigned_long,_18446744073709551615UL>::end(in_RSI);
    if (this_00 == pbVar1) break;
    uint64_value(this_01,in_RDI,(semantic_tag)((ulong)this_00 >> 0x38),in_stack_ffffffffffffffb8,
                 (error_code *)0x3728be);
    this_00 = this_01 + 1;
  }
  end_array(this_00,in_stack_ffffffffffffffb8,(error_code *)0x3728e2);
  return true;
}

Assistant:

virtual JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const uint64_t>& s, 
            semantic_tag tag,
            const ser_context& context, 
            std::error_code& ec) 
        {
            begin_array(s.size(), tag, context, ec);
            for (auto p = s.begin(); p != s.end(); ++p)
            {
                uint64_value(*p,semantic_tag::none,context, ec);
            }
            end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }